

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int cvLsPSolve(void *cvode_mem,N_Vector r,N_Vector z,realtype tol,int lr)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_30;
  CVodeMem local_28;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"cvLsPSolve",&local_28,&local_30);
  if (iVar1 == 0) {
    iVar1 = (*local_30->psolve)(local_28->cv_tn,local_30->ycur,local_30->fcur,r,z,local_28->cv_gamma
                                ,tol,lr,local_30->P_data);
    local_30->nps = local_30->nps + 1;
  }
  return iVar1;
}

Assistant:

int cvLsPSolve(void *cvode_mem, N_Vector r, N_Vector z, realtype tol, int lr)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "cvLsPSolve",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* call the user-supplied psolve routine, and accumulate count */
  retval = cvls_mem->psolve(cv_mem->cv_tn, cvls_mem->ycur,
                            cvls_mem->fcur, r, z,
                            cv_mem->cv_gamma, tol, lr,
                            cvls_mem->P_data);
  cvls_mem->nps++;
  return(retval);
}